

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O0

int CVodeSetProjFrequency(void *cvode_mem,long freq)

{
  long in_RSI;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  int retval;
  CVodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = cvAccessProjMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            in_stack_ffffffffffffffc8,(CVodeProjMem *)0xeff689);
  if (local_4 == 0) {
    if (in_RSI < 0) {
      in_stack_ffffffffffffffd0[0x10] = '\x01';
      in_stack_ffffffffffffffd0[0x11] = '\0';
      in_stack_ffffffffffffffd0[0x12] = '\0';
      in_stack_ffffffffffffffd0[0x13] = '\0';
      in_stack_ffffffffffffffd0[0x14] = '\0';
      in_stack_ffffffffffffffd0[0x15] = '\0';
      in_stack_ffffffffffffffd0[0x16] = '\0';
      in_stack_ffffffffffffffd0[0x17] = '\0';
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x5f8) = 1;
    }
    else if (in_RSI == 0) {
      in_stack_ffffffffffffffd0[0x10] = '\0';
      in_stack_ffffffffffffffd0[0x11] = '\0';
      in_stack_ffffffffffffffd0[0x12] = '\0';
      in_stack_ffffffffffffffd0[0x13] = '\0';
      in_stack_ffffffffffffffd0[0x14] = '\0';
      in_stack_ffffffffffffffd0[0x15] = '\0';
      in_stack_ffffffffffffffd0[0x16] = '\0';
      in_stack_ffffffffffffffd0[0x17] = '\0';
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x5f8) = 0;
    }
    else {
      *(long *)(in_stack_ffffffffffffffd0 + 0x10) = in_RSI;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x5f8) = 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetProjFrequency(void *cvode_mem, long int freq)
{
  int          retval;
  CVodeMem     cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, "CVodeSetProjFrequency",
                           &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) return(retval);

  /* Set projection frequency */
  if (freq < 0)
  {
    /* Restore default */
    proj_mem->freq  = 1;
    cv_mem->proj_enabled = SUNTRUE;
  }
  else if (freq == 0)
  {
    /* Disable projection */
    proj_mem->freq = 0;
    cv_mem->proj_enabled = SUNFALSE;
  }
  else
  {
    /* Enable projection at given frequency */
    proj_mem->freq = freq;
    cv_mem->proj_enabled = SUNTRUE;
  }

  return(CV_SUCCESS);
}